

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mtsr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_i64 pTVar1;
  TCGTemp *local_28;
  TCGTemp *local_20;
  long local_18;
  
  if (ctx->pr != true) {
    tcg_ctx = ctx->uc->tcg_ctx;
    pTVar1 = tcg_const_i64_ppc64(tcg_ctx,(ulong)(*(ushort *)((long)&ctx->opcode + 2) & 0xf));
    local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_18 = (long)&tcg_ctx->pool_cur +
               *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8));
    local_20 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_store_sr_ppc64,(TCGTemp *)0x0,3,&local_28);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    return;
  }
  gen_exception_err(ctx,6,0x31);
  return;
}

Assistant:

static void gen_mtsr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    CHK_SV;
    t0 = tcg_const_tl(tcg_ctx, SR(ctx->opcode));
    gen_helper_store_sr(tcg_ctx, tcg_ctx->cpu_env, t0, cpu_gpr[rS(ctx->opcode)]);
    tcg_temp_free(tcg_ctx, t0);
}